

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O2

void UpsampleRgba4444LinePair_C
               (uint8_t *top_y,uint8_t *bottom_y,uint8_t *top_u,uint8_t *top_v,uint8_t *cur_u,
               uint8_t *cur_v,uint8_t *top_dst,uint8_t *bottom_dst,int len)

{
  uint8_t *puVar1;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint8_t *puVar2;
  
  lVar5 = (long)len - 1;
  uVar11 = (uint)*top_v << 0x10 | (uint)*top_u;
  uVar9 = (uint)*cur_v << 0x10 | (uint)*cur_u;
  uVar4 = uVar11 * 3 + uVar9 + 0x20002;
  VP8YuvToRgba4444((uint)*top_y,uVar4 >> 2 & 0xff,uVar4 >> 0x12,top_dst);
  if (bottom_y != (uint8_t *)0x0) {
    uVar4 = uVar9 * 3 + uVar11 + 0x20002;
    VP8YuvToRgba4444((uint)*bottom_y,uVar4 >> 2 & 0xff,uVar4 >> 0x12,bottom_dst);
  }
  lVar12 = 1;
  puVar1 = top_dst;
  puVar2 = bottom_dst;
  while( true ) {
    if ((int)lVar5 >> 1 < lVar12) break;
    uVar6 = (uint)top_v[lVar12] << 0x10 | (uint)top_u[lVar12];
    uVar7 = (uint)cur_v[lVar12] << 0x10 | (uint)cur_u[lVar12];
    iVar3 = uVar9 + uVar11 + uVar6 + uVar7;
    uVar8 = iVar3 + (uVar6 + uVar9) * 2 + 0x80008 >> 3;
    uVar10 = iVar3 + (uVar7 + uVar11) * 2 + 0x80008 >> 3;
    uVar11 = uVar11 + uVar8;
    uVar4 = uVar10 + uVar6;
    VP8YuvToRgba4444((uint)top_y[lVar12 * 2 + -1],uVar11 >> 1 & 0xff,uVar11 >> 0x11,puVar1 + 2);
    VP8YuvToRgba4444((uint)top_y[lVar12 * 2],uVar4 >> 1 & 0xff,uVar4 >> 0x11,puVar1 + 4);
    if (bottom_y != (uint8_t *)0x0) {
      uVar10 = uVar10 + uVar9;
      uVar8 = uVar8 + uVar7;
      VP8YuvToRgba4444((uint)bottom_y[lVar12 * 2 + -1],uVar10 >> 1 & 0xff,uVar10 >> 0x11,puVar2 + 2)
      ;
      VP8YuvToRgba4444((uint)bottom_y[lVar12 * 2],uVar8 >> 1 & 0xff,uVar8 >> 0x11,puVar2 + 4);
    }
    lVar12 = lVar12 + 1;
    puVar1 = puVar1 + 4;
    puVar2 = puVar2 + 4;
    uVar11 = uVar6;
    uVar9 = uVar7;
  }
  if (((long)len & 1U) == 0) {
    uVar4 = uVar9 + uVar11 * 3 + 0x20002;
    iVar3 = (int)lVar5 * 2;
    VP8YuvToRgba4444((uint)top_y[lVar5],uVar4 >> 2 & 0xff,uVar4 >> 0x12,top_dst + iVar3);
    if (bottom_y != (uint8_t *)0x0) {
      uVar11 = uVar11 + uVar9 * 3 + 0x20002;
      VP8YuvToRgba4444((uint)bottom_y[lVar5],uVar11 >> 2 & 0xff,uVar11 >> 0x12,bottom_dst + iVar3);
      return;
    }
  }
  return;
}

Assistant:

static void EmptyUpsampleFunc(const uint8_t* top_y, const uint8_t* bottom_y,
                              const uint8_t* top_u, const uint8_t* top_v,
                              const uint8_t* cur_u, const uint8_t* cur_v,
                              uint8_t* top_dst, uint8_t* bottom_dst, int len) {
  (void)top_y;
  (void)bottom_y;
  (void)top_u;
  (void)top_v;
  (void)cur_u;
  (void)cur_v;
  (void)top_dst;
  (void)bottom_dst;
  (void)len;
  assert(0);   // COLORSPACE SUPPORT NOT COMPILED
}